

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O2

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::step_three(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
             *this)

{
  pointer puVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bvector_impl *p_Var4;
  unsigned_long uVar5;
  ulong uVar6;
  pointer pVVar7;
  pointer pAVar8;
  unsigned_long *row;
  pointer puVar9;
  reference rVar10;
  _Bit_const_iterator __first;
  _Bit_const_iterator __last;
  undefined1 local_29;
  
  puVar1 = (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar9 = (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1) {
    uVar5 = *puVar9;
    pVVar7 = (this->graph_->vertices_).
             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pAVar8 = *(pointer *)&((Adjacencies *)((long)(pVVar7 + uVar5) + 0x20))->vector_;
        pAVar8 != *(pointer *)((long)(pVVar7 + uVar5) + 0x28); pAVar8 = pAVar8 + 1) {
      if ((this->mask_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[pAVar8->edge_] == 1) {
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->col_cover,
                            pAVar8->vertex_ -
                            ((long)(this->rows_).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->rows_).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
        *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
        uVar5 = *puVar9;
        pVVar7 = (this->graph_->vertices_).
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  p_Var4 = &(this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar2 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
  uVar3 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_offset = uVar3;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar2;
  local_29 = 1;
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       (this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_start.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  uVar6 = std::__count_if<std::_Bit_const_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                    (__first,__last,(_Iter_equals_val<const_bool>)&local_29);
  this->step_ = (uint)(this->max_matches_ <= uVar6) * 3 + FOUR;
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::step_three()
{
    for (auto const& row : rows_)
        for (auto it = graph_.adjacenciesFromVertexBegin(row);
             it != graph_.adjacenciesFromVertexEnd(row); ++it)
            if (mask_[it->edge()] == STARRED)
                col_cover[col_of_idx(it->vertex())] = true;

    const size_t col_count =
        std::count(col_cover.cbegin(), col_cover.cend(), true);

    // if the matching is already perfect, then we are done.
    if (col_count >= max_matches_)
        step_ = Step::SEVEN;
    else
        step_ = Step::FOUR;
}